

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  BIT_CStream_t bitC;
  BIT_CStream_t local_38;
  
  if (dstSize < 8) {
    return 0;
  }
  local_38.endPtr = (char *)((long)dst + (dstSize - 8));
  uVar5 = 0;
  if (dstSize == 8) {
    return 0;
  }
  uVar9 = srcSize & 0xfffffffffffffffc;
  uVar7 = (uint)srcSize & 3;
  local_38.bitContainer = (size_t)uVar7;
  local_38.ptr = (char *)dst;
  switch(uVar7) {
  case 0:
    goto switchD_0012bb8d_caseD_0;
  case 1:
    uVar8 = 0;
    goto LAB_0012bbc9;
  case 2:
    uVar8 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar9 + 2);
    uVar5 = (ulong)CTable[bVar1].val;
    uVar8 = (ulong)CTable[bVar1].nbBits;
  }
  bVar1 = *(byte *)((long)src + uVar9 + 1);
  uVar5 = uVar5 | (ulong)CTable[bVar1].val << (uVar8 & 0x3f);
  uVar8 = (ulong)((uint)CTable[bVar1].nbBits + (int)uVar8);
LAB_0012bbc9:
  local_38.bitContainer = (ulong)CTable[*(byte *)((long)src + uVar9)].val << (uVar8 & 0x3f) | uVar5;
  uVar7 = (uint)CTable[*(byte *)((long)src + uVar9)].nbBits + (int)uVar8;
  *(size_t *)dst = local_38.bitContainer;
  local_38.ptr = (char *)((ulong)(uVar7 >> 3) + (long)dst);
  if (local_38.endPtr < local_38.ptr) {
    local_38.ptr = local_38.endPtr;
  }
  uVar5 = (ulong)(uVar7 & 7);
  local_38.bitContainer = local_38.bitContainer >> ((ulong)((byte)uVar7 & 0xf8) & 0x3f);
switchD_0012bb8d_caseD_0:
  while (local_38.bitPos = (uint)uVar5, uVar9 != 0) {
    bVar1 = *(byte *)((long)src + (uVar9 - 1));
    local_38.bitPos = CTable[bVar1].nbBits + local_38.bitPos;
    bVar2 = *(byte *)((long)src + (uVar9 - 2));
    uVar7 = CTable[bVar2].nbBits + local_38.bitPos;
    bVar3 = *(byte *)((long)src + (uVar9 - 3));
    uVar10 = CTable[bVar3].nbBits + uVar7;
    bVar4 = *(byte *)((long)src + (uVar9 - 4));
    uVar9 = uVar9 - 4;
    local_38.bitContainer =
         (ulong)CTable[bVar4].val << ((ulong)uVar10 & 0x3f) |
         (ulong)CTable[bVar3].val << ((ulong)uVar7 & 0x3f) |
         (ulong)CTable[bVar2].val << ((ulong)local_38.bitPos & 0x3f) |
         (ulong)CTable[bVar1].val << uVar5 | local_38.bitContainer;
    uVar10 = CTable[bVar4].nbBits + uVar10;
    *(size_t *)local_38.ptr = local_38.bitContainer;
    local_38.ptr = (char *)((ulong)(uVar10 >> 3) + (long)local_38.ptr);
    if (local_38.endPtr < local_38.ptr) {
      local_38.ptr = local_38.endPtr;
    }
    uVar5 = (ulong)(uVar10 & 7);
    local_38.bitContainer = local_38.bitContainer >> ((ulong)((byte)uVar10 & 0xf8) & 0x3f);
  }
  local_38.startPtr = (char *)dst;
  sVar6 = BIT_closeCStream(&local_38);
  return sVar6;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    size_t n;
    BIT_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = BIT_initCStream(&bitC, op, oend-op);
      if (HUF_isError(initErr)) return 0; }

    n = srcSize & ~3;  /* join to mod 4 */
    switch (srcSize & 3)
    {
        case 3 : HUF_encodeSymbol(&bitC, ip[n+ 2], CTable);
                 HUF_FLUSHBITS_2(&bitC);
		 /* fall-through */
        case 2 : HUF_encodeSymbol(&bitC, ip[n+ 1], CTable);
                 HUF_FLUSHBITS_1(&bitC);
		 /* fall-through */
        case 1 : HUF_encodeSymbol(&bitC, ip[n+ 0], CTable);
                 HUF_FLUSHBITS(&bitC);
		 /* fall-through */
        case 0 : /* fall-through */
        default: break;
    }

    for (; n>0; n-=4) {  /* note : n&3==0 at this stage */
        HUF_encodeSymbol(&bitC, ip[n- 1], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 2], CTable);
        HUF_FLUSHBITS_2(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 3], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 4], CTable);
        HUF_FLUSHBITS(&bitC);
    }

    return BIT_closeCStream(&bitC);
}